

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *
pbrt::Image::GenerateMIPMap
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>
           *__return_storage_ptr__,Image *image,WrapMode2D wrapMode,Allocator alloc)

{
  PixelFormat format;
  size_t sVar1;
  int iVar2;
  Allocator alloc_00;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Point2i newResolution;
  uint uVar6;
  long end;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  span<const_float> buf;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  Point2i levelResolution;
  int nChannels;
  int srcDeltas [4];
  Image nextImage;
  Tuple2<pbrt::Point2,_int> local_220;
  PixelFormat local_214;
  int local_210;
  int local_20c;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *local_208;
  uint local_1fc;
  undefined4 local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  Allocator local_1e0;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_1d8;
  Tuple2<pbrt::Point2,_int> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  Image local_1c0;
  _Any_data local_a8;
  code *pcStack_98;
  code *pcStack_90;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_88;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_80;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *local_78;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *local_70;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *local_68;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *local_60;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  ColorEncodingHandle local_50;
  ColorEncodingHandle local_48;
  ColorEncodingHandle local_40;
  ColorEncodingHandle local_38;
  
  local_214 = image->format;
  local_20c = (int)(image->channelNames).nStored;
  local_1d8.bits =
       (image->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  iVar2 = (image->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_1e0.memoryResource = alloc.memoryResource;
  if ((POPCOUNT(iVar2) == 1) &&
     (POPCOUNT((image->resolution).super_Tuple2<pbrt::Point2,_int>.y) == 1)) {
    if (local_214 == Float) goto LAB_0045a4bd;
    local_38.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    ConvertToFormat(&local_1c0,image,Float,&local_38);
    (image->resolution).super_Tuple2<pbrt::Point2,_int>.y =
         local_1c0.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    image->format = local_1c0.format;
    (image->resolution).super_Tuple2<pbrt::Point2,_int>.x =
         local_1c0.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&image->channelNames,&local_1c0.channelNames);
    (image->encoding).
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (uintptr_t)
            local_1c0.encoding.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&image->p8,&local_1c0.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&image->p16,&local_1c0.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&image->p32,&local_1c0.p32);
    local_1c0.p32.nStored = 0;
    (*(local_1c0.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p32.alloc.memoryResource,local_1c0.p32.ptr,local_1c0.p32.nAlloc << 2,4);
    local_1c0.p16.nStored = 0;
    (*(local_1c0.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p16.alloc.memoryResource,local_1c0.p16.ptr,local_1c0.p16.nAlloc * 2,2);
    local_1c0.p8.nStored = 0;
    (*(local_1c0.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p8.alloc.memoryResource,local_1c0.p8.ptr,local_1c0.p8.nAlloc,1);
  }
  else {
    uVar6 = iVar2 - 1;
    uVar6 = (int)uVar6 >> 1 | uVar6;
    uVar6 = (int)uVar6 >> 2 | uVar6;
    uVar6 = (int)uVar6 >> 4 | uVar6;
    uVar6 = (int)uVar6 >> 8 | uVar6;
    newResolution.super_Tuple2<pbrt::Point2,_int>.x = ((int)uVar6 >> 0x10 | uVar6) + 1;
    uVar6 = (image->resolution).super_Tuple2<pbrt::Point2,_int>.y - 1;
    uVar6 = (int)uVar6 >> 1 | uVar6;
    uVar6 = (int)uVar6 >> 2 | uVar6;
    uVar6 = (int)uVar6 >> 4 | uVar6;
    uVar6 = (int)uVar6 >> 8 | uVar6;
    newResolution.super_Tuple2<pbrt::Point2,_int>.y = ((int)uVar6 >> 0x10 | uVar6) + 1;
    FloatResize(&local_1c0,image,newResolution,wrapMode);
    (image->resolution).super_Tuple2<pbrt::Point2,_int>.y =
         local_1c0.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    image->format = local_1c0.format;
    (image->resolution).super_Tuple2<pbrt::Point2,_int>.x =
         local_1c0.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&image->channelNames,&local_1c0.channelNames);
    (image->encoding).
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (uintptr_t)
            local_1c0.encoding.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&image->p8,&local_1c0.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&image->p16,&local_1c0.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&image->p32,&local_1c0.p32);
    local_1c0.p32.nStored = 0;
    (*(local_1c0.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p32.alloc.memoryResource,local_1c0.p32.ptr,local_1c0.p32.nAlloc << 2,4);
    local_1c0.p16.nStored = 0;
    (*(local_1c0.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p16.alloc.memoryResource,local_1c0.p16.ptr,local_1c0.p16.nAlloc * 2,2);
    local_1c0.p8.nStored = 0;
    (*(local_1c0.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p8.alloc.memoryResource,local_1c0.p8.ptr,local_1c0.p8.nAlloc,1);
  }
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_1c0.channelNames);
LAB_0045a4bd:
  if (image->format != Float) {
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x8b,"Check failed: %s",(char (*) [22])"Is32Bit(image.format)");
  }
  iVar2 = (image->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = (image->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  if (iVar3 < iVar2) {
    iVar3 = iVar2;
  }
  uVar6 = LZCOUNT(iVar3);
  (__return_storage_ptr__->alloc).memoryResource = local_1e0.memoryResource;
  __return_storage_ptr__->ptr = (Image *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::reserve
            (__return_storage_ptr__,(ulong)(0x20 - uVar6));
  local_1fc = uVar6 ^ 0x1f;
  local_220 = (image->resolution).super_Tuple2<pbrt::Point2,_int>;
  local_210 = 0;
  local_208 = __return_storage_ptr__;
  if (uVar6 != 0x1f) {
    local_58 = &image->channelNames;
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(image->channelNames).field_2;
    local_68 = &image->p8;
    local_60 = &local_1c0.p8;
    local_78 = &image->p16;
    local_70 = &local_1c0.p16;
    local_88 = &image->p32;
    local_80 = &local_1c0.p32;
    do {
      pbVar4 = (image->channelNames).ptr;
      if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar4 = local_1c8;
      }
      local_48.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )local_1d8.bits;
      channels.n = (image->channelNames).nStored;
      channels.ptr = pbVar4;
      Image(&local_1c0,local_214,(Point2i)local_220,channels,&local_48,local_1e0);
      pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::push_back
                (__return_storage_ptr__,&local_1c0);
      local_1c0.p32.nStored = 0;
      (*(local_1c0.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1c0.p32.alloc.memoryResource,local_1c0.p32.ptr,local_1c0.p32.nAlloc << 2,4);
      local_1c0.p16.nStored = 0;
      (*(local_1c0.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1c0.p16.alloc.memoryResource,local_1c0.p16.ptr,local_1c0.p16.nAlloc * 2,2);
      local_1c0.p8.nStored = 0;
      (*(local_1c0.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1c0.p8.alloc.memoryResource,local_1c0.p8.ptr,local_1c0.p8.nAlloc,1);
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_1c0.channelNames);
      auVar7._8_8_ = 0;
      auVar7._0_4_ = local_220.x;
      auVar7._4_4_ = local_220.y;
      auVar8 = vpsrld_avx(auVar7,0x1f);
      auVar8 = vpaddd_avx(auVar7,auVar8);
      auVar7 = vpsrad_avx(auVar8,1);
      auVar8._8_4_ = 1;
      auVar8._0_8_ = 0x100000001;
      auVar8._12_4_ = 1;
      auVar8 = vpmaxsd_avx512vl(auVar7,auVar8);
      format = image->format;
      pbVar4 = (image->channelNames).ptr;
      if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar4 = local_1c8;
      }
      sVar1 = (image->channelNames).nStored;
      local_50.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )local_1d8.bits;
      local_1d0 = auVar8._0_8_;
      alloc_00.memoryResource = pstd::pmr::new_delete_resource();
      channels_00.n = sVar1;
      channels_00.ptr = pbVar4;
      Image(&local_1c0,format,(Point2i)auVar8._0_8_,channels_00,&local_50,alloc_00);
      __return_storage_ptr__ = local_208;
      local_1f8 = 0;
      local_1f4 = local_20c;
      iVar2 = local_220.x * local_20c;
      local_1ec = local_20c + iVar2;
      if (local_220.x == 1) {
        local_1f4 = 0;
        local_1ec = iVar2;
      }
      local_1f0 = iVar2;
      if (local_220.y == 1) {
        local_1f0 = 0;
        local_1ec = local_1ec - iVar2;
      }
      end = (long)local_1d0.y;
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = 0;
      pcStack_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      local_a8._M_unused._M_object = operator_new(0x40);
      *(Image **)local_a8._M_unused._0_8_ = image;
      *(Image **)((long)local_a8._M_unused._0_8_ + 8) = &local_1c0;
      *(Tuple2<pbrt::Point2,_int> **)((long)local_a8._M_unused._0_8_ + 0x10) = &local_1d0;
      *(int **)((long)local_a8._M_unused._0_8_ + 0x18) = &local_20c;
      *(undefined4 **)((long)local_a8._M_unused._0_8_ + 0x20) = &local_1f8;
      *(Tuple2<pbrt::Point2,_int> **)((long)local_a8._M_unused._0_8_ + 0x28) = &local_220;
      *(vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> **)
       ((long)local_a8._M_unused._0_8_ + 0x30) = __return_storage_ptr__;
      *(int **)((long)local_a8._M_unused._0_8_ + 0x38) = &local_210;
      pcStack_90 = std::
                   _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp:172:43)>
                   ::_M_invoke;
      pcStack_98 = std::
                   _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp:172:43)>
                   ::_M_manager;
      ParallelFor(0,end,(function<void_(long,_long)> *)&local_a8);
      if (pcStack_98 != (code *)0x0) {
        (*pcStack_98)(&local_a8,&local_a8,__destroy_functor);
      }
      (image->resolution).super_Tuple2<pbrt::Point2,_int>.y =
           local_1c0.resolution.super_Tuple2<pbrt::Point2,_int>.y;
      image->format = local_1c0.format;
      (image->resolution).super_Tuple2<pbrt::Point2,_int>.x =
           local_1c0.resolution.super_Tuple2<pbrt::Point2,_int>.x;
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(local_58,&local_1c0.channelNames);
      (image->encoding).
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (uintptr_t)
              local_1c0.encoding.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (local_68,local_60);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (local_78,local_70);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(local_88,local_80);
      local_220 = local_1d0;
      local_1c0.p32.nStored = 0;
      (*(local_1c0.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1c0.p32.alloc.memoryResource,local_1c0.p32.ptr,local_1c0.p32.nAlloc << 2,4);
      local_1c0.p16.nStored = 0;
      (*(local_1c0.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1c0.p16.alloc.memoryResource,local_1c0.p16.ptr,local_1c0.p16.nAlloc * 2,2);
      local_1c0.p8.nStored = 0;
      (*(local_1c0.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1c0.p8.alloc.memoryResource,local_1c0.p8.ptr,local_1c0.p8.nAlloc,1);
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_1c0.channelNames);
      local_210 = local_210 + 1;
    } while (local_210 < (int)local_1fc);
  }
  if ((local_220.x == 1) && (local_220.y == 1)) {
    pbVar4 = (image->channelNames).ptr;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(image->channelNames).field_2;
    if (pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar5 = pbVar4;
    }
    local_40.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_1d8.bits;
    channels_01.n = (image->channelNames).nStored;
    channels_01.ptr = pbVar5;
    Image(&local_1c0,local_214,(Point2i)local_220,channels_01,&local_40,local_1e0);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::push_back
              (__return_storage_ptr__,&local_1c0);
    local_1c0.p32.nStored = 0;
    (*(local_1c0.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p32.alloc.memoryResource,local_1c0.p32.ptr,local_1c0.p32.nAlloc << 2,4);
    local_1c0.p16.nStored = 0;
    (*(local_1c0.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p16.alloc.memoryResource,local_1c0.p16.ptr,local_1c0.p16.nAlloc * 2,2);
    local_1c0.p8.nStored = 0;
    (*(local_1c0.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.p8.alloc.memoryResource,local_1c0.p8.ptr,local_1c0.p8.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_1c0.channelNames);
    local_1c0.format = U256;
    local_1c0.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
    local_1c0.resolution.super_Tuple2<pbrt::Point2,_int>.y = 1;
    local_1c0._12_4_ = 1;
    buf.n = (size_t)local_20c;
    buf.ptr = (image->p32).ptr;
    CopyRectIn(__return_storage_ptr__->ptr + local_1fc,(Bounds2i *)&local_1c0,buf);
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[51]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0xcd,"Check failed: %s",
             (char (*) [51])"levelResolution[0] == 1 && levelResolution[1] == 1");
}

Assistant:

pstd::vector<Image> Image::GenerateMIPMap(Image image, WrapMode2D wrapMode,
                                          Allocator alloc) {
    PixelFormat origFormat = image.format;
    int nChannels = image.NChannels();
    ColorEncodingHandle origEncoding = image.encoding;

    // Set things up so we have a power-of-two sized image stored with
    // floats.
    if (!IsPowerOf2(image.resolution[0]) || !IsPowerOf2(image.resolution[1])) {
        // Resample image to power-of-two resolution
        image = image.FloatResize(
            {RoundUpPow2(image.resolution[0]), RoundUpPow2(image.resolution[1])},
            wrapMode);
    } else if (!Is32Bit(image.format))
        image = image.ConvertToFormat(PixelFormat::Float);
    CHECK(Is32Bit(image.format));

    // Initialize levels of MIPMap from image
    int nLevels = 1 + Log2Int(std::max(image.resolution[0], image.resolution[1]));
    pstd::vector<Image> pyramid(alloc);
    pyramid.reserve(nLevels);

    Point2i levelResolution = image.resolution;
    for (int i = 0; i < nLevels - 1; ++i) {
        // Initialize $i+1$st MIPMap level from $i$th level and also convert
        // i'th level to the internal format
        pyramid.push_back(
            Image(origFormat, levelResolution, image.channelNames, origEncoding, alloc));

        Point2i nextResolution(std::max(1, levelResolution[0] / 2),
                               std::max(1, levelResolution[1] / 2));
        Image nextImage(image.format, nextResolution, image.channelNames, origEncoding);

        // Offsets from the base pixel to the four neighbors that we'll
        // downfilter.
        int srcDeltas[4] = {0, nChannels, nChannels * levelResolution[0],
                            nChannels * levelResolution[0] + nChannels};
        // Clamp offsets once a dimension has a single texel.
        if (levelResolution[0] == 1) {
            srcDeltas[1] = 0;
            srcDeltas[3] -= nChannels;
        }
        if (levelResolution[1] == 1) {
            srcDeltas[2] = 0;
            srcDeltas[3] -= nChannels * levelResolution[0];
        }

        // Work in scanlines for best cache coherence (vs 2d tiles).
        ParallelFor(0, nextResolution[1], [&](int64_t y0, int64_t y1) {
            for (int y = y0; y < y1; ++y) {
                // Downfilter with a box filter for the next MIP level
                int srcOffset = image.PixelOffset({0, 2 * y});
                int nextOffset = nextImage.PixelOffset({0, y});
                for (int x = 0; x < nextResolution[0]; ++x) {
                    for (int c = 0; c < nChannels; ++c) {
                        nextImage.p32[nextOffset] =
                            .25f *
                            (image.p32[srcOffset] + image.p32[srcOffset + srcDeltas[1]] +
                             image.p32[srcOffset + srcDeltas[2]] +
                             image.p32[srcOffset + srcDeltas[3]]);
                        ++srcOffset;
                        ++nextOffset;
                    }
                    srcOffset += nChannels;
                }

                // Copy the current level out to the current pyramid level
                int yStart = 2 * y;
                int yEnd = std::min(2 * y + 2, levelResolution[1]);
                int offset = image.PixelOffset({0, yStart});
                size_t count = (yEnd - yStart) * nChannels * levelResolution[0];
                pyramid[i].CopyRectIn(Bounds2i({0, yStart}, {levelResolution[0], yEnd}),
                                      {image.p32.data() + offset, count});
            }
        });

        image = std::move(nextImage);
        levelResolution = nextResolution;
    }

    // Top level
    CHECK(levelResolution[0] == 1 && levelResolution[1] == 1);
    pyramid.push_back(
        Image(origFormat, levelResolution, image.channelNames, origEncoding, alloc));
    pyramid[nLevels - 1].CopyRectIn({{0, 0}, {1, 1}},
                                    {image.p32.data(), size_t(nChannels)});

    return pyramid;
}